

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector3 * vector3_reflect_by_quaternion(vector3 *self,quaternion *qT)

{
  undefined1 local_28 [8];
  quaternion q;
  quaternion *qT_local;
  vector3 *self_local;
  
  q.field_0._8_8_ = qT;
  quaternion_set((quaternion *)local_28,qT);
  quaternion_multiplyv3((quaternion *)local_28,self);
  quaternion_multiply((quaternion *)local_28,(quaternion *)q.field_0._8_8_);
  quaternion_normalize((quaternion *)local_28);
  (self->field_0).v[0] = (float)local_28._0_4_;
  (self->field_0).v[1] = (float)local_28._4_4_;
  (self->field_0).v[2] = q.field_0.q[0];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_reflect_by_quaternion(struct vector3 *self, const struct quaternion *qT)
{
	struct quaternion q;

	quaternion_set(&q, qT);
	quaternion_multiplyv3(&q, self);
	quaternion_multiply(&q, qT);

	/* this seems to be necessary */
	quaternion_normalize(&q);

	self->x = q.x;
	self->y = q.y;
	self->z = q.z;

	return self;
}